

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::enterInitializingMode(Federate *this)

{
  Modes MVar1;
  uint uVar2;
  element_type *peVar3;
  undefined8 uVar4;
  char *in_RDI;
  Federate *unaff_retaddr;
  HelicsException *anon_var_0;
  Modes cmode;
  Federate *in_stack_00000140;
  undefined7 in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffc8;
  
  MVar1 = std::atomic<helics::Federate::Modes>::load
                    ((atomic<helics::Federate::Modes> *)(in_RDI + 8),seq_cst);
  if (MVar1 == STARTUP) {
    if ((in_RDI[0xf] & 1U) != 0) {
      potentialInterfacesStartupSequence(in_stack_00000140);
    }
    peVar3 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2062c2);
    uVar2 = (*peVar3->_vptr_Core[0x13])(peVar3,(ulong)*(uint *)(in_RDI + 0x10),0);
    if ((uVar2 & 1) != 0) {
      enteringInitializingMode
                ((Federate *)CONCAT17(MVar1,in_stack_ffffffffffffffc0),
                 (IterationResult)((ulong)in_RDI >> 0x38));
    }
  }
  else if (MVar1 != INITIALIZING) {
    if (MVar1 != PENDING_INIT) {
      uVar4 = __cxa_allocate_exception(0x28);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(MVar1,in_stack_ffffffffffffffc0),in_RDI);
      InvalidFunctionCall::InvalidFunctionCall
                ((InvalidFunctionCall *)CONCAT17(MVar1,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffc8);
      __cxa_throw(uVar4,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
    enterInitializingModeComplete(unaff_retaddr);
  }
  return;
}

Assistant:

void Federate::enterInitializingMode()
{
    auto cmode = currentMode.load();
    switch (cmode) {
        case Modes::STARTUP:
            try {
                if (hasPotentialInterfaces) {
                    potentialInterfacesStartupSequence();
                }

                if (coreObject->enterInitializingMode(fedID)) {
                    enteringInitializingMode(IterationResult::NEXT_STEP);
                }
            }
            catch (const HelicsException&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
            break;
        case Modes::PENDING_INIT:
            enterInitializingModeComplete();
            break;
        case Modes::INITIALIZING:
            break;
        default:
            throw(InvalidFunctionCall("cannot transition from current mode to initializing mode"));
    }
}